

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

Vec_Str_t *
Acb_GeneratePatch(Acb_Ntk_t *p,Vec_Int_t *vDivs,Vec_Int_t *vUsed,Vec_Ptr_t *vSops,Vec_Ptr_t *vGias,
                 Vec_Int_t *vTars)

{
  Vec_Str_t *pVVar1;
  int iVar2;
  int iVar3;
  uint nNodes;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  Vec_Wec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  int *piVar8;
  Vec_Int_t *pVVar9;
  char *pcVar10;
  Vec_Int_t *p_03;
  void *pvVar11;
  char *pcVar12;
  uint local_104;
  uint local_fc;
  char *pName_1;
  char *pName;
  int *pCounts;
  int nMffc;
  int nPoCount;
  int nPiCount;
  Vec_Int_t *vTfo;
  Vec_Int_t *vTfi;
  Vec_Int_t *vDrf;
  Vec_Int_t *vSup;
  Vec_Str_t *vStr;
  Vec_Ptr_t *vNames;
  int nGates0 [5];
  uint local_78 [2];
  int nGates1 [5];
  int fFirst;
  int nWires;
  int iObj;
  int k;
  int i;
  int nOuts;
  Vec_Int_t *vGate;
  Vec_Wec_t *vGates;
  Vec_Int_t *vTars_local;
  Vec_Ptr_t *vGias_local;
  Vec_Ptr_t *vSops_local;
  Vec_Int_t *vUsed_local;
  Vec_Int_t *vDivs_local;
  Acb_Ntk_t *p_local;
  
  if (vGias == (Vec_Ptr_t *)0x0) {
    p_00 = Abc_SopSynthesize(vSops);
    local_fc = Vec_PtrSize(vSops);
  }
  else {
    p_00 = Abc_GiaSynthesize(vGias,(Gia_Man_t *)0x0);
    local_fc = Vec_PtrSize(vGias);
  }
  iVar2 = Vec_WecSize(p_00);
  iVar3 = Vec_IntSize(vUsed);
  nNodes = (iVar2 - iVar3) - local_fc;
  nGates1[4] = 1;
  memset(local_78,0,0x14);
  memset(&vNames,0,0x14);
  vStr = (Vec_Str_t *)Acb_GenerateSignalNames(p,vDivs,vUsed,nNodes,vTars,p_00);
  vSup = (Vec_Int_t *)Vec_StrAlloc(100);
  vDrf = Acb_GetUsedDivs(vDivs,vUsed);
  vTfi = Acb_GetDerefedNodes(p);
  p_01 = Acb_ObjCollectTfiVec(p,vDrf);
  p_02 = Acb_ObjCollectTfoVec(p,vTars);
  uVar4 = Acb_NtkCountPiBuffers(p,vDrf);
  uVar5 = Acb_NtkCountPoDrivers(p,vTars);
  if (vTfi == (Vec_Int_t *)0x0) {
    local_104 = 0;
  }
  else {
    iVar2 = Vec_IntSize(vTars);
    iVar3 = Acb_NtkFindMffcSize(p,vDrf,vTfi,(int *)local_78);
    local_104 = iVar2 + iVar3;
  }
  piVar8 = Abc_FrameReadGateCounts();
  for (iObj = 0; iObj < 5; iObj = iObj + 1) {
    local_78[iObj] = piVar8[iObj] + local_78[iObj];
  }
  Vec_IntFree(vDrf);
  for (iObj = Vec_IntSize(vUsed); iVar2 = Vec_IntSize(vUsed), pVVar9 = vSup,
      iObj < (int)(iVar2 + nNodes); iObj = iObj + 1) {
    pVVar9 = Vec_WecEntry(p_00,iObj);
    iVar2 = Vec_IntSize(pVVar9);
    if (iVar2 < 3) {
      iVar2 = Vec_IntEntry(pVVar9,0);
      nGates0[(long)(int)(uint)(iVar2 == 8) + -2] = nGates0[(long)(int)(uint)(iVar2 == 8) + -2] + 1;
    }
    else {
      iVar2 = Vec_IntEntry(pVVar9,0);
      pcVar10 = Acb_Oper2Name(iVar2);
      iVar2 = strcmp(pcVar10,"buf");
      if (iVar2 == 0) {
        nGates0[0] = nGates0[0] + 1;
      }
      else {
        iVar2 = strcmp(pcVar10,"not");
        if (iVar2 == 0) {
          nGates0[1] = nGates0[1] + 1;
        }
        else {
          iVar2 = Vec_IntSize(pVVar9);
          nGates0[2] = iVar2 + -3 + nGates0[2];
        }
      }
    }
  }
  uVar6 = Vec_IntSize(vUsed);
  iVar2 = Vec_IntSize(p_01);
  iVar3 = Vec_IntSize(p_02);
  Vec_StrPrintF((Vec_Str_t *)pVVar9,
                "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
                (ulong)uVar6,(ulong)local_fc,(ulong)uVar4,(ulong)uVar5,iVar2,iVar3);
  Vec_StrPrintF((Vec_Str_t *)vSup,
                "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                (ulong)nNodes,(ulong)(uint)vNames,(ulong)vNames._4_4_,(ulong)(uint)nGates0[0],
                nGates0[1],nGates0[2]);
  if (vTfi != (Vec_Int_t *)0x0) {
    Vec_StrPrintF((Vec_Str_t *)vSup,
                  "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)local_104,(ulong)local_78[0],(ulong)local_78[1],(ulong)(uint)nGates1[0],
                  nGates1[1],nGates1[2]);
  }
  if (vTfi != (Vec_Int_t *)0x0) {
    Vec_StrPrintF((Vec_Str_t *)vSup,
                  "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                  (ulong)(nNodes - local_104),(ulong)((uint)vNames - local_78[0]),
                  (ulong)(vNames._4_4_ - local_78[1]),(ulong)(uint)(nGates0[0] - nGates1[0]),
                  nGates0[1] - nGates1[1],nGates0[2] - nGates1[2]);
  }
  Vec_StrPrintF((Vec_Str_t *)vSup,"\n");
  Vec_StrAppend((Vec_Str_t *)vSup,"module patch (");
  uVar6 = Vec_IntSize(vTars);
  if (uVar6 == local_fc) {
    for (iObj = 0; iVar2 = Vec_IntSize(vTars), iObj < iVar2; iObj = iObj + 1) {
      iVar2 = Vec_IntEntry(vTars,iObj);
      pVVar9 = vSup;
      pcVar10 = "";
      if (iObj != 0) {
        pcVar10 = ",";
      }
      pcVar12 = Acb_ObjNameStr(p,iVar2);
      Vec_StrPrintF((Vec_Str_t *)pVVar9,"%s %s",pcVar10,pcVar12);
    }
    for (iObj = 0; iVar2 = Vec_IntSize(vUsed), iObj < iVar2; iObj = iObj + 1) {
      iVar2 = Vec_IntEntry(vUsed,iObj);
      iVar2 = Vec_IntEntry(vDivs,iVar2);
      pVVar9 = vSup;
      pcVar10 = Acb_ObjNameStr(p,iVar2);
      Vec_StrPrintF((Vec_Str_t *)pVVar9,", %s",pcVar10);
    }
    Vec_StrAppend((Vec_Str_t *)vSup," );\n\n");
    Vec_StrAppend((Vec_Str_t *)vSup,"  output");
    for (iObj = 0; iVar2 = Vec_IntSize(vTars), iObj < iVar2; iObj = iObj + 1) {
      iVar2 = Vec_IntEntry(vTars,iObj);
      pVVar9 = vSup;
      pcVar10 = "";
      if (iObj != 0) {
        pcVar10 = ",";
      }
      pcVar12 = Acb_ObjNameStr(p,iVar2);
      Vec_StrPrintF((Vec_Str_t *)pVVar9,"%s %s",pcVar10,pcVar12);
    }
    Vec_StrAppend((Vec_Str_t *)vSup,";\n");
    Vec_StrAppend((Vec_Str_t *)vSup,"  input");
    for (iObj = 0; iVar2 = Vec_IntSize(vUsed), iObj < iVar2; iObj = iObj + 1) {
      iVar2 = Vec_IntEntry(vUsed,iObj);
      iVar2 = Vec_IntEntry(vDivs,iVar2);
      pVVar9 = vSup;
      pcVar10 = "";
      if (iObj != 0) {
        pcVar10 = ",";
      }
      pcVar12 = Acb_ObjNameStr(p,iVar2);
      Vec_StrPrintF((Vec_Str_t *)pVVar9,"%s %s",pcVar10,pcVar12);
    }
    Vec_StrAppend((Vec_Str_t *)vSup,";\n");
    if ((int)local_fc < (int)nNodes) {
      Vec_StrAppend((Vec_Str_t *)vSup,"  wire");
      for (iObj = 0; pVVar1 = vStr, iObj < (int)nNodes; iObj = iObj + 1) {
        iVar2 = Vec_IntSize(vUsed);
        pcVar10 = (char *)Vec_PtrEntry((Vec_Ptr_t *)pVVar1,iVar2 + iObj);
        iVar2 = strncmp(pcVar10,"ww",2);
        if (iVar2 == 0) {
          pcVar12 = ",";
          if (nGates1[4] != 0) {
            pcVar12 = "";
          }
          Vec_StrPrintF((Vec_Str_t *)vSup,"%s %s",pcVar12,pcVar10);
          nGates1[4] = 0;
        }
      }
      Vec_StrAppend((Vec_Str_t *)vSup,";\n\n");
    }
    iObj = Vec_IntSize(vUsed);
    do {
      iVar2 = Vec_IntSize(vUsed);
      if ((int)(iVar2 + nNodes) <= iObj) {
        Vec_StrAppend((Vec_Str_t *)vSup,"\nendmodule\n\n");
        Vec_StrPush((Vec_Str_t *)vSup,'\0');
        Vec_PtrFreeFree((Vec_Ptr_t *)vStr);
        Vec_WecFree(p_00);
        printf("\n");
        uVar6 = Vec_IntSize(vUsed);
        uVar7 = Vec_IntSize(p_01);
        iVar2 = Vec_IntSize(p_02);
        printf("Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n",
               (ulong)uVar6,(ulong)local_fc,(ulong)uVar4,(ulong)uVar5,(ulong)uVar7,iVar2);
        printf("Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
               (ulong)nNodes,(ulong)(uint)vNames,(ulong)vNames._4_4_,(ulong)(uint)nGates0[0],
               (ulong)(uint)nGates0[1],nGates0[2]);
        if (vTfi != (Vec_Int_t *)0x0) {
          printf("Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                 (ulong)local_104,(ulong)local_78[0],(ulong)local_78[1],(ulong)(uint)nGates1[0],
                 (ulong)(uint)nGates1[1],nGates1[2]);
        }
        if (vTfi != (Vec_Int_t *)0x0) {
          printf("TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n",
                 (ulong)(nNodes - local_104),(ulong)((uint)vNames - local_78[0]),
                 (ulong)(vNames._4_4_ - local_78[1]),(ulong)(uint)(nGates0[0] - nGates1[0]),
                 (ulong)(uint)(nGates0[1] - nGates1[1]),nGates0[2] - nGates1[2]);
        }
        printf("\n");
        Vec_IntFreeP(&vTfi);
        return (Vec_Str_t *)vSup;
      }
      p_03 = Vec_WecEntry(p_00,iObj);
      iVar2 = Vec_IntSize(p_03);
      pVVar9 = vSup;
      if (iVar2 < 3) {
        iVar2 = Vec_IntEntry(p_03,0);
        if ((iVar2 != 7) && (iVar2 = Vec_IntEntry(p_03,0), iVar2 != 8)) {
          __assert_fail("Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                        ,0x7f0,
                        "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
                       );
        }
        pVVar9 = vSup;
        pcVar10 = Acb_Oper2Name(0xb);
        Vec_StrPrintF((Vec_Str_t *)pVVar9,"  %s (",pcVar10);
        pVVar1 = vStr;
        pVVar9 = vSup;
        iVar2 = Vec_IntEntry(p_03,1);
        pvVar11 = Vec_PtrEntry((Vec_Ptr_t *)pVVar1,iVar2);
        Vec_StrPrintF((Vec_Str_t *)pVVar9," %s, ",pvVar11);
        pVVar9 = vSup;
        iVar2 = Vec_IntEntry(p_03,0);
        Vec_StrPrintF((Vec_Str_t *)pVVar9," 1\'b%d",(ulong)(iVar2 == 8));
        Vec_StrPrintF((Vec_Str_t *)vSup," );\n");
      }
      else {
        iVar2 = Vec_IntEntry(p_03,0);
        pcVar10 = Acb_Oper2Name(iVar2);
        Vec_StrPrintF((Vec_Str_t *)pVVar9,"  %s (",pcVar10);
        for (nWires = 1; iVar2 = Vec_IntSize(p_03), nWires < iVar2; nWires = nWires + 1) {
          iVar2 = Vec_IntEntry(p_03,nWires);
          pVVar9 = vSup;
          pcVar10 = "";
          if (1 < nWires) {
            pcVar10 = ",";
          }
          pvVar11 = Vec_PtrEntry((Vec_Ptr_t *)vStr,iVar2);
          Vec_StrPrintF((Vec_Str_t *)pVVar9,"%s %s",pcVar10,pvVar11);
        }
        Vec_StrAppend((Vec_Str_t *)vSup," );\n");
      }
      iObj = iObj + 1;
    } while( true );
  }
  __assert_fail("Vec_IntSize(vTars) == nOuts",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x7c7,
                "Vec_Str_t *Acb_GeneratePatch(Acb_Ntk_t *, Vec_Int_t *, Vec_Int_t *, Vec_Ptr_t *, Vec_Ptr_t *, Vec_Int_t *)"
               );
}

Assistant:

Vec_Str_t * Acb_GeneratePatch( Acb_Ntk_t * p, Vec_Int_t * vDivs, Vec_Int_t * vUsed, Vec_Ptr_t * vSops, Vec_Ptr_t * vGias, Vec_Int_t * vTars )
{
    extern Vec_Wec_t * Abc_SopSynthesize( Vec_Ptr_t * vSops );
    extern Vec_Wec_t * Abc_GiaSynthesize( Vec_Ptr_t * vGias, Gia_Man_t * pMulti );
    Vec_Wec_t * vGates = vGias ? Abc_GiaSynthesize(vGias, NULL) : Abc_SopSynthesize(vSops);  Vec_Int_t * vGate;
    int nOuts = vGias ? Vec_PtrSize(vGias) : Vec_PtrSize(vSops);
    int i, k, iObj, nWires = Vec_WecSize(vGates) - Vec_IntSize(vUsed) - nOuts, fFirst = 1;
    int nGates1[5] = {0}, nGates0[5] = {0};
    Vec_Ptr_t * vNames = Acb_GenerateSignalNames( p, vDivs, vUsed, nWires, vTars, vGates );
    Vec_Str_t * vStr = Vec_StrAlloc( 100 );
    Vec_Int_t * vSup = Acb_GetUsedDivs( vDivs, vUsed );
    Vec_Int_t * vDrf = Acb_GetDerefedNodes( p );
    Vec_Int_t * vTfi = Acb_ObjCollectTfiVec( p, vSup );
    Vec_Int_t * vTfo = Acb_ObjCollectTfoVec( p, vTars );
    int nPiCount = Acb_NtkCountPiBuffers( p, vSup );
    int nPoCount = Acb_NtkCountPoDrivers( p, vTars );
    int nMffc    = vDrf ? Vec_IntSize(vTars) + Acb_NtkFindMffcSize( p, vSup, vDrf, nGates1 ) : 0;
    int * pCounts = Abc_FrameReadGateCounts();
    for ( i = 0; i < 5; i++ )
        nGates1[i] += pCounts[i];
    Vec_IntFree( vSup );
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            char * pName = Acb_Oper2Name(Vec_IntEntry(vGate, 0));
            if ( !strcmp(pName, "buf") )
                nGates0[2]++;
            else if ( !strcmp(pName, "not") )
                nGates0[3]++;
            else
                nGates0[4] += Vec_IntSize(vGate) - 3;
        }
        else
            nGates0[Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T]++;
    }

    Vec_StrPrintF( vStr, "// Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    Vec_StrPrintF( vStr, "// Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    Vec_StrPrintF( vStr, "// TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc, nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    Vec_StrPrintF( vStr, "\n" );

    Vec_StrAppend( vStr, "module patch (" );

    assert( Vec_IntSize(vTars) == nOuts );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, ", %s", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, " );\n\n" );

    Vec_StrAppend( vStr, "  output" );
    Vec_IntForEachEntry( vTars, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    Vec_StrAppend( vStr, "  input" );
    Vec_IntForEachEntryInVec( vDivs, vUsed, iObj, i )
        Vec_StrPrintF( vStr, "%s %s", i ? ",":"", Acb_ObjNameStr(p, iObj) );
    Vec_StrAppend( vStr, ";\n" );

    if ( nWires > nOuts )
    {
        Vec_StrAppend( vStr, "  wire" );
        for ( i = 0; i < nWires; i++ )
        {
            char * pName = (char *)Vec_PtrEntry( vNames, Vec_IntSize(vUsed)+i );
            if ( !strncmp(pName, "ww", 2) )
                Vec_StrPrintF( vStr, "%s %s", fFirst ? "":",", pName ), fFirst = 0;
        }
        Vec_StrAppend( vStr, ";\n\n" );
    }

    // create internal nodes
    Vec_WecForEachLevelStartStop( vGates, vGate, i, Vec_IntSize(vUsed), Vec_IntSize(vUsed)+nWires )
    {
        if ( Vec_IntSize(vGate) > 2 )
        {
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name(Vec_IntEntry(vGate, 0)) );
            Vec_IntForEachEntryStart( vGate, iObj, k, 1 )
                Vec_StrPrintF( vStr, "%s %s", k > 1 ? ",":"", (char *)Vec_PtrEntry(vNames, iObj) );
            Vec_StrAppend( vStr, " );\n" );
        }
        else
        {
            assert( Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_F || Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, "  %s (", Acb_Oper2Name( ABC_OPER_BIT_BUF ) );
            Vec_StrPrintF( vStr, " %s, ", (char *)Vec_PtrEntry(vNames, Vec_IntEntry(vGate, 1)) );
            Vec_StrPrintF( vStr, " 1\'b%d", Vec_IntEntry(vGate, 0) == ABC_OPER_CONST_T );
            Vec_StrPrintF( vStr, " );\n" );
        }
    }
    Vec_StrAppend( vStr, "\nendmodule\n\n" );
    Vec_StrPush( vStr, '\0' );
    Vec_PtrFreeFree( vNames );
    Vec_WecFree( vGates );

//    printf( "Synthesized patch with %d inputs, %d outputs and %d gates (const = %d  buf = %d  inv = %d  other = %d).\n", 
//        Vec_IntSize(vUsed), nOuts, nWires, nConst, nBufs, nInvs, nNodes );
//    printf( "Summary of the results\n" );
    printf( "\n" );
    printf( "Patch   : in = %d  out = %d : pi_in = %d  po_out = %d : tfi = %d  tfo = %d\n", Vec_IntSize(vUsed), nOuts, nPiCount, nPoCount, Vec_IntSize(vTfi), Vec_IntSize(vTfo) );
    printf( "Added   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires,         nGates0[0], nGates0[1], nGates0[2], nGates0[3], nGates0[4] ); 
    if ( vDrf != NULL )
    printf( "Removed : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nMffc,          nGates1[0], nGates1[1], nGates1[2], nGates1[3], nGates1[4] ); 
    if ( vDrf != NULL )
    printf( "TOTAL   : gate =%4d : c0 =%2d  c1 =%2d  buf =%3d  inv =%3d  two-input =%4d\n", nWires-nMffc,   nGates0[0]-nGates1[0],  nGates0[1]-nGates1[1],  nGates0[2]-nGates1[2], nGates0[3]-nGates1[3], nGates0[4]-nGates1[4] ); 
    printf( "\n" );
    Vec_IntFreeP( &vDrf );
    return vStr;
}